

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O1

void Decode4Base64ToBytes(char *FourCharBlock,uint8_t *ThreeByteBlock)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = ""[(byte)FourCharBlock[1] & 0x7f];
  bVar2 = ""[(byte)FourCharBlock[2] & 0x7f];
  bVar3 = FourCharBlock[3];
  *ThreeByteBlock = bVar1 >> 4 | ""[(byte)*FourCharBlock & 0x7f] << 2;
  ThreeByteBlock[1] = bVar2 >> 2 | bVar1 << 4;
  ThreeByteBlock[2] = bVar2 << 6 | ""[bVar3 & 0x7f];
  return;
}

Assistant:

void
    Decode4Base64ToBytes
    (
        char const*         FourCharBlock,          // [in]
        uint8_t*            ThreeByteBlock          // [out]
    )
{
    // Convert the characters into 6 bit values
    uint8_t sixBitValues [4] = {0};

    sixBitValues[0] = BASE64INVERT[ FourCharBlock[0] & 0x7f ];
    sixBitValues[1] = BASE64INVERT[ FourCharBlock[1] & 0x7f ];
    sixBitValues[2] = BASE64INVERT[ FourCharBlock[2] & 0x7f ];
    sixBitValues[3] = BASE64INVERT[ FourCharBlock[3] & 0x7f ];

    // Assemble the 6 bit values into three bytes.
    ThreeByteBlock[0] = ( sixBitValues[0] << 2 ) | ( sixBitValues[1] >> 4 );
    ThreeByteBlock[1] = ( sixBitValues[1] << 4 ) | ( sixBitValues[2] >> 2 );
    ThreeByteBlock[2] = ( sixBitValues[2] << 6 ) | ( sixBitValues[3] );
}